

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TableSetupColumn
               (char *label,ImGuiTableColumnFlags flags,float init_width_or_weight,ImGuiID user_id)

{
  ImGuiTable *pIVar1;
  ImS8 IVar2;
  ImGuiTableColumnFlags IVar3;
  int iVar4;
  ImGuiTableColumn *pIVar5;
  ImGuiID in_EDX;
  uint in_ESI;
  char *in_RDI;
  float in_XMM0_Da;
  ImGuiTableColumn *column;
  ImGuiTable *table;
  ImGuiContext *g;
  undefined8 in_stack_ffffffffffffffb8;
  ImGuiTable *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  ImSpan<ImGuiTableColumn> *in_stack_ffffffffffffffd0;
  ImGuiContext *str_end;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar6;
  
  IVar3 = (ImGuiTableColumnFlags)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  iVar4 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  pIVar1 = GImGui->CurrentTable;
  str_end = GImGui;
  if (pIVar1 == (ImGuiTable *)0x0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x2479,"TableSetupColumn","ImGui ASSERT FAILED: %s",
                "table != NULL && \"Need to call TableSetupColumn() after BeginTable()!\"");
  }
  if ((pIVar1->IsLayoutLocked & 1U) != 0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x247a,"TableSetupColumn","ImGui ASSERT FAILED: %s",
                "!table->IsLayoutLocked && \"Need to call call TableSetupColumn() before first row!\""
               );
  }
  if ((pIVar1->DeclColumnsCount < '\0') || (pIVar1->ColumnsCount <= (int)pIVar1->DeclColumnsCount))
  {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x247b,"TableSetupColumn","ImGui ASSERT FAILED: %s",
                "table->DeclColumnsCount >= 0 && table->DeclColumnsCount < table->ColumnsCount && \"Called TableSetupColumn() too many times!\""
               );
  }
  pIVar5 = ImSpan<ImGuiTableColumn>::operator[](in_stack_ffffffffffffffd0,iVar4);
  pIVar1->DeclColumnsCount = pIVar1->DeclColumnsCount + '\x01';
  if ((((in_ESI & 0x1c) == 0) && ((pIVar1->Flags & 0x8000U) != 0)) && (0.0 < in_XMM0_Da)) {
    in_ESI = in_ESI | 4;
  }
  pIVar5->UserID = in_EDX;
  pIVar5->FlagsIn = in_ESI;
  IVar3 = TableFixColumnFlags(in_stack_ffffffffffffffc0,IVar3);
  pIVar5->Flags = IVar3;
  uVar6 = pIVar5->Flags;
  if ((uVar6 & 8) != 0) {
    if ((in_XMM0_Da == 0.0) && (!NAN(in_XMM0_Da))) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,0x248f,"TableSetupColumn","ImGui ASSERT FAILED: %s",
                  "init_width_or_weight != 0.0f && \"Need to provide a valid weight!\"");
    }
    if (in_XMM0_Da < 0.0) {
      in_XMM0_Da = 1.0;
    }
  }
  pIVar5->WidthOrWeightInitValue = in_XMM0_Da;
  if ((((pIVar1->IsInitializing & 1U) != 0) &&
      (pIVar5->WidthRequest <= 0.0 && pIVar5->WidthRequest != 0.0)) &&
     (pIVar5->WidthStretchWeight <= 0.0 && pIVar5->WidthStretchWeight != 0.0)) {
    if (((uVar6 & 4) != 0) && (0.0 < in_XMM0_Da)) {
      pIVar5->WidthRequest = in_XMM0_Da;
      pIVar5->AutoFitQueue = '\0';
    }
    if ((uVar6 & 8) == 0) {
      pIVar5->WidthStretchWeight = 1.0;
    }
    else {
      pIVar5->WidthStretchWeight = in_XMM0_Da;
    }
  }
  if ((pIVar1->IsInitializing & 1U) != 0) {
    if (((uVar6 & 1) != 0) && ((pIVar1->SettingsLoadedFlags & 4U) == 0)) {
      pIVar5->IsVisibleNextFrame = false;
      pIVar5->IsVisible = false;
    }
    if (((uVar6 & 2) != 0) && ((pIVar1->SettingsLoadedFlags & 8U) == 0)) {
      pIVar5->SortOrder = '\0';
      IVar2 = '\x01';
      if ((pIVar5->Flags & 0x2000U) != 0) {
        IVar2 = '\x02';
      }
      pIVar5->SortDirection = IVar2;
    }
  }
  if (pIVar5->NameOffset != -1) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x24af,"TableSetupColumn","ImGui ASSERT FAILED: %s","column->NameOffset == -1");
  }
  if (in_RDI != (char *)0x0) {
    iVar4 = ImGuiTextBuffer::size(&pIVar1->ColumnsNames);
    pIVar5->NameOffset = (ImS16)iVar4;
    strlen(in_RDI);
    ImGuiTextBuffer::append
              ((ImGuiTextBuffer *)CONCAT44(uVar6,in_XMM0_Da),
               (char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),&str_end->Initialized);
  }
  return;
}

Assistant:

void    ImGui::TableSetupColumn(const char* label, ImGuiTableColumnFlags flags, float init_width_or_weight, ImGuiID user_id)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableSetupColumn() after BeginTable()!");
    IM_ASSERT(!table->IsLayoutLocked && "Need to call call TableSetupColumn() before first row!");
    IM_ASSERT(table->DeclColumnsCount >= 0 && table->DeclColumnsCount < table->ColumnsCount && "Called TableSetupColumn() too many times!");

    ImGuiTableColumn* column = &table->Columns[table->DeclColumnsCount];
    table->DeclColumnsCount++;

    // When passing a width automatically enforce WidthFixed policy
    // (vs TableFixColumnFlags would default to WidthAlwaysAutoResize)
    // (we write to FlagsIn which is a little misleading, another solution would be to pass init_width_or_weight to TableFixColumnFlags)
    if ((flags & ImGuiTableColumnFlags_WidthMask_) == 0)
        if ((table->Flags & ImGuiTableFlags_SizingPolicyFixedX) && (init_width_or_weight > 0.0f))
            flags |= ImGuiTableColumnFlags_WidthFixed;

    column->UserID = user_id;
    column->FlagsIn = flags;
    column->Flags = TableFixColumnFlags(table, column->FlagsIn);
    flags = column->Flags;

    // Initialize defaults
    if (flags & ImGuiTableColumnFlags_WidthStretch)
    {
        IM_ASSERT(init_width_or_weight != 0.0f && "Need to provide a valid weight!");
        if (init_width_or_weight < 0.0f)
            init_width_or_weight = 1.0f;
    }
    column->WidthOrWeightInitValue = init_width_or_weight;
    if (table->IsInitializing && column->WidthRequest < 0.0f && column->WidthStretchWeight < 0.0f)
    {
        // Init width or weight
        if ((flags & ImGuiTableColumnFlags_WidthFixed) && init_width_or_weight > 0.0f)
        {
            // Disable auto-fit if a default fixed width has been specified
            column->WidthRequest = init_width_or_weight;
            column->AutoFitQueue = 0x00;
        }
        if (flags & ImGuiTableColumnFlags_WidthStretch)
            column->WidthStretchWeight = init_width_or_weight;
        else
            column->WidthStretchWeight = 1.0f;
    }
    if (table->IsInitializing)
    {
        // Init default visibility/sort state
        if ((flags & ImGuiTableColumnFlags_DefaultHide) && (table->SettingsLoadedFlags & ImGuiTableFlags_Hideable) == 0)
            column->IsVisible = column->IsVisibleNextFrame = false;
        if (flags & ImGuiTableColumnFlags_DefaultSort && (table->SettingsLoadedFlags & ImGuiTableFlags_Sortable) == 0)
        {
            column->SortOrder = 0; // Multiple columns using _DefaultSort will be reordered when building the sort specs.
            column->SortDirection = (column->Flags & ImGuiTableColumnFlags_PreferSortDescending) ? (ImS8)ImGuiSortDirection_Descending : (ImU8)(ImGuiSortDirection_Ascending);
        }
    }

    // Store name (append with zero-terminator in contiguous buffer)
    IM_ASSERT(column->NameOffset == -1);
    if (label != NULL)
    {
        column->NameOffset = (ImS16)table->ColumnsNames.size();
        table->ColumnsNames.append(label, label + strlen(label) + 1);
    }
}